

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_port.h
# Opt level: O0

void __thiscall
sc_core::sc_port<sc_core::sc_signal_inout_if<bool>,_1,_(sc_core::sc_port_policy)0>::sc_port
          (sc_port<sc_core::sc_signal_inout_if<bool>,_1,_(sc_core::sc_port_policy)0> *this,
          char *name_,base_type *parent_)

{
  socklen_t __len;
  char *in_RDX;
  sockaddr *__addr;
  sc_port_b<sc_core::sc_signal_inout_if<bool>_> *in_RSI;
  sc_port_b<sc_core::sc_signal_inout_if<bool>_> *in_RDI;
  sc_port_policy in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int __fd;
  
  sc_port_b<sc_core::sc_signal_inout_if<bool>_>::sc_port_b
            (in_RSI,in_RDX,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0);
  __fd = (int)in_RDX;
  __len = 0x362650;
  (in_RDI->super_sc_port_base).super_sc_object._vptr_sc_object = (_func_int **)&PTR_print_00362650;
  sc_warn_port_constructor();
  sc_port_b<sc_core::sc_signal_inout_if<bool>_>::bind(in_RDI,__fd,__addr,__len);
  return;
}

Assistant:

sc_port( const char* name_, base_type& parent_ )
	: base_type( name_, N, P )
	{ sc_warn_port_constructor(); base_type::bind( parent_ ); }